

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

void cf_gcm_encrypt_init(cf_prp *prp,void *prpctx,cf_gcm_ctx *gcmctx,uint8_t *header,size_t nheader,
                        uint8_t *nonce,size_t nnonce)

{
  uint8_t local_48 [8];
  uint8_t H [16];
  uint8_t *nonce_local;
  size_t nheader_local;
  uint8_t *header_local;
  cf_gcm_ctx *gcmctx_local;
  void *prpctx_local;
  cf_prp *prp_local;
  
  H._8_8_ = nonce;
  memset(local_48,0,0x10);
  (*prp->encrypt)(prpctx,local_48,local_48);
  if (nnonce == 0xc) {
    memcpy(gcmctx->Y0,(void *)H._8_8_,0xc);
    gcmctx->Y0[0xe] = '\0';
    gcmctx->Y0[0xd] = '\0';
    gcmctx->Y0[0xc] = '\0';
    gcmctx->Y0[0xf] = '\x01';
  }
  else {
    ghash_init(&gcmctx->gh,local_48);
    ghash_add_cipher(&gcmctx->gh,(uint8_t *)H._8_8_,nnonce);
    ghash_final(&gcmctx->gh,gcmctx->Y0);
  }
  ghash_init(&gcmctx->gh,local_48);
  ghash_add_aad(&gcmctx->gh,header,nheader);
  memset(gcmctx->e_Y0,0,0x10);
  cf_ctr_init(&gcmctx->ctr,prp,prpctx,gcmctx->Y0);
  cf_ctr_custom_counter(&gcmctx->ctr,0xc,4);
  cf_ctr_cipher(&gcmctx->ctr,gcmctx->e_Y0,gcmctx->e_Y0,0x10);
  mem_clean(local_48,0x10);
  return;
}

Assistant:

void cf_gcm_encrypt_init(const cf_prp *prp, void *prpctx, cf_gcm_ctx *gcmctx,
                         const uint8_t *header, size_t nheader,
                         const uint8_t *nonce, size_t nnonce)
{
  uint8_t H[16] = { 0 };

  /* H = E_K(0^128) */
  prp->encrypt(prpctx, H, H);

  /* Produce CTR nonce, Y_0:
   *
   * if len(IV) == 96
   *   Y_0 = IV || 0^31 || 1
   * otherwise
   *   Y_0 = GHASH(H, {}, IV)
   */

  if (nnonce == 12)
  {
    memcpy(gcmctx->Y0, nonce, nnonce);
    gcmctx->Y0[12] = gcmctx->Y0[13] = gcmctx->Y0[14] = 0x00;
    gcmctx->Y0[15] = 0x01;
  } else {
    ghash_init(&gcmctx->gh, H);
    ghash_add_cipher(&gcmctx->gh, nonce, nnonce);
    ghash_final(&gcmctx->gh, gcmctx->Y0);
  }

  /* Hash AAD */
  ghash_init(&gcmctx->gh, H);
  ghash_add_aad(&gcmctx->gh, header, nheader);

  /* Produce ciphertext */
  memset(gcmctx->e_Y0, 0, sizeof(gcmctx->e_Y0));
  cf_ctr_init(&gcmctx->ctr, prp, prpctx, gcmctx->Y0);
  cf_ctr_custom_counter(&gcmctx->ctr, 12, 4); /* counter is 2^32 */
  cf_ctr_cipher(&gcmctx->ctr, gcmctx->e_Y0, gcmctx->e_Y0, sizeof gcmctx->e_Y0); /* first block is tag offset */

  mem_clean(H, sizeof H);
}